

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFont *pIVar1;
  ImVector<ImFontConfig> *pIVar2;
  ImFontConfig *pIVar3;
  ImFont **ppIVar4;
  ImVector<ImFontConfig> *in_RDI;
  ImFont *font;
  ImFont **__end1_1;
  ImFont **__begin1_1;
  ImVector<ImFont_*> *__range1_1;
  ImFontConfig *font_cfg;
  ImFontConfig *__end1;
  ImFontConfig *__begin1;
  ImVector<ImFontConfig> *__range1;
  ImFont **local_38;
  ImFontConfig *local_18;
  
  pIVar2 = in_RDI + 7;
  local_18 = ImVector<ImFontConfig>::begin((ImVector<ImFontConfig> *)&pIVar2->Data);
  pIVar3 = ImVector<ImFontConfig>::end((ImVector<ImFontConfig> *)&pIVar2->Data);
  for (; local_18 != pIVar3; local_18 = local_18 + 1) {
    if ((local_18->FontData != (void *)0x0) && ((local_18->FontDataOwnedByAtlas & 1U) != 0)) {
      ImGui::MemFree(in_RDI);
      local_18->FontData = (void *)0x0;
    }
  }
  pIVar2 = in_RDI + 5;
  local_38 = ImVector<ImFont_*>::begin((ImVector<ImFont_*> *)&pIVar2->Data);
  ppIVar4 = ImVector<ImFont_*>::end((ImVector<ImFont_*> *)&pIVar2->Data);
  for (; local_38 != ppIVar4; local_38 = local_38 + 1) {
    pIVar1 = *local_38;
    if ((*(ImFontConfig **)(in_RDI + 8) <= pIVar1->ConfigData) &&
       (pIVar1->ConfigData <
        (ImFontConfig *)(*(long *)(in_RDI + 8) + (long)*(int *)&in_RDI[7].Data * 0x90))) {
      pIVar1->ConfigData = (ImFontConfig *)0x0;
      pIVar1->ConfigDataCount = 0;
    }
  }
  ImVector<ImFontConfig>::clear(in_RDI);
  ImVector<ImFontAtlasCustomRect>::clear((ImVector<ImFontAtlasCustomRect> *)in_RDI);
  *(undefined4 *)&in_RDI[0x49].Data = 0xffffffff;
  in_RDI[0x49].Capacity = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (ImFontConfig& font_cfg : ConfigData)
        if (font_cfg.FontData && font_cfg.FontDataOwnedByAtlas)
        {
            IM_FREE(font_cfg.FontData);
            font_cfg.FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (ImFont* font : Fonts)
        if (font->ConfigData >= ConfigData.Data && font->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            font->ConfigData = NULL;
            font->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}